

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::doLayout(QColumnViewPrivate *this)

{
  QWidgetData *pQVar1;
  QWidget *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int ah;
  int i;
  ulong uVar7;
  int i_1;
  
  if (((this->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) &&
     ((this->columns).d.size != 0)) {
    pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    pQVar2 = *(QWidget **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    ah = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
    iVar4 = QWidget::x((QWidget *)*(this->columns).d.ptr);
    bVar3 = QWidget::isRightToLeft(pQVar2);
    if (bVar3) {
      pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
               data;
      iVar4 = (pQVar1->crect).x2.m_i;
      iVar6 = (pQVar1->crect).x1.m_i;
      iVar5 = (**(code **)(*(long *)pQVar2 + 0x2b0))(pQVar2);
      iVar4 = (iVar4 - iVar6) + iVar5 + 1;
      for (uVar7 = 0; uVar7 < (ulong)(this->columns).d.size; uVar7 = uVar7 + 1) {
        pQVar2 = (QWidget *)(this->columns).d.ptr[uVar7];
        iVar4 = iVar4 + ~(pQVar2->data->crect).x2.m_i + (pQVar2->data->crect).x1.m_i;
        iVar6 = QWidget::x(pQVar2);
        pQVar1 = pQVar2->data;
        if ((iVar4 != iVar6) || (ah != ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1)) {
          QWidget::setGeometry
                    (pQVar2,iVar4,0,((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1,ah);
        }
      }
    }
    else {
      for (uVar7 = 0; uVar7 < (ulong)(this->columns).d.size; uVar7 = uVar7 + 1) {
        pQVar2 = (QWidget *)(this->columns).d.ptr[uVar7];
        iVar5 = ((pQVar2->data->crect).x2.m_i - (pQVar2->data->crect).x1.m_i) + 1;
        iVar6 = QWidget::x(pQVar2);
        if ((iVar4 != iVar6) ||
           (ah != ((pQVar2->data->crect).y2.m_i - (pQVar2->data->crect).y1.m_i) + 1)) {
          QWidget::setGeometry(pQVar2,iVar4,0,iVar5,ah);
        }
        iVar4 = iVar4 + iVar5;
      }
    }
  }
  return;
}

Assistant:

void QColumnViewPrivate::doLayout()
{
    Q_Q(QColumnView);
    if (!model || columns.isEmpty())
        return;

    int viewportHeight = viewport->height();
    int x = columns.at(0)->x();

    if (q->isRightToLeft()) {
        x = viewport->width() + q->horizontalOffset();
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            x -= view->width();
            if (x != view->x() || viewportHeight != view->height())
                view->setGeometry(x, 0, view->width(), viewportHeight);
        }
    } else {
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            int currentColumnWidth = view->width();
            if (x != view->x() || viewportHeight != view->height())
                view->setGeometry(x, 0, currentColumnWidth, viewportHeight);
            x += currentColumnWidth;
        }
    }
}